

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

void __thiscall
GenericModelItem::insertRows(GenericModelItem *this,int row,QVector<GenericModelItem_*> *rows)

{
  QVector<GenericModelItem_*> *this_00;
  int iVar1;
  reference ppGVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong i;
  int iVar10;
  
  lVar9 = (long)this->m_colCount * (long)row;
  this_00 = &this->children;
  iVar1 = (int)(this->children).d.size;
  iVar10 = iVar1 - (int)lVar9;
  iVar7 = (int)((rows->d).size / (long)this->m_colCount);
  if (iVar10 != 0 && (int)lVar9 <= iVar1) {
    do {
      ppGVar2 = QList<GenericModelItem_*>::operator[](this_00,lVar9);
      (*ppGVar2)->m_row = (*ppGVar2)->m_row + iVar7;
      lVar9 = lVar9 + 1;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  uVar8 = (uint)(rows->d).size;
  if (0 < (int)uVar8) {
    i = 0;
    do {
      ppGVar2 = QList<GenericModelItem_*>::operator[](rows,i);
      (*ppGVar2)->parent = this;
      iVar1 = this->m_colCount;
      ppGVar2 = QList<GenericModelItem_*>::operator[](rows,i);
      (*ppGVar2)->m_row =
           (int)((long)((ulong)(uint)((int)i >> 0x1f) << 0x20 | i & 0xffffffff) / (long)iVar1) + row
      ;
      i = i + 1;
    } while ((uVar8 & 0x7fffffff) != i);
  }
  lVar9 = (rows->d).size;
  if (lVar9 != 0) {
    QtPrivate::QPodArrayOps<GenericModelItem_*>::insert
              ((QPodArrayOps<GenericModelItem_*> *)this_00,(long)this->m_colCount * (long)row,lVar9,
               (parameter_type)0x0);
  }
  iVar3 = QList<GenericModelItem_*>::begin(rows);
  iVar4 = QList<GenericModelItem_*>::end(rows);
  iVar5 = QList<GenericModelItem_*>::begin(this_00);
  lVar9 = (long)iVar4.i - (long)iVar3.i >> 3;
  if (0 < lVar9) {
    iVar1 = this->m_colCount;
    lVar9 = lVar9 + 1;
    lVar6 = 0;
    do {
      *(undefined8 *)((long)iVar5.i + lVar6 + (long)(row * iVar1) * 8) =
           *(undefined8 *)((long)iVar3.i + lVar6);
      lVar9 = lVar9 + -1;
      lVar6 = lVar6 + 8;
    } while (1 < lVar9);
  }
  this->m_rowCount = this->m_rowCount + iVar7;
  return;
}

Assistant:

void GenericModelItem::insertRows(int row, QVector<GenericModelItem *> rows)
{
    Q_ASSERT(row >= 0 && row <= m_rowCount);
    Q_ASSERT(!rows.isEmpty());
    Q_ASSERT(rows.count() % m_colCount == 0);
    const int count = rows.count() / m_colCount;
    for (int i = row * m_colCount, maxI = children.size(); i < maxI; ++i)
        children[i]->m_row += count;
    for (int i = 0, maxI = rows.size(); i < maxI; ++i) {
        rows[i]->parent = this;
        rows[i]->m_row = row + (i / m_colCount);
    }
    children.insert(row * m_colCount, rows.size(), nullptr);
    std::copy(rows.begin(), rows.end(), children.begin() + (row * m_colCount));
    m_rowCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    Q_ASSERT(std::all_of(children.constBegin(), children.constEnd(), [](GenericModelItem *item) -> bool { return item != nullptr; }));
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}